

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# N.cpp
# Opt level: O1

type std::__detail::__variant::
     __gen_vtable_impl<std::__detail::__variant::_Multi_array<std::__detail::__variant::__deduce_visit_result<void>(*)(TEMPNAMEPLACEHOLDERVALUE(std::ostream&,N_const&)::$_0&&,std::variant<std::__cxx11::string,int,double,NS*>const&)>,std::integer_sequence<unsigned_long,2ul>>
     ::operator<<(anon_class_8_1_75b11cdb *__visitor,
                 variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_double,_NS_*>
                 *__vars)

{
  std::ostream::_M_insert<double>
            (*(double *)
              &(__vars->
               super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_double,_NS_*>
               ).super__Move_assign_alias<std::__cxx11::basic_string<char>,_int,_double,_NS_*>.
               super__Copy_assign_alias<std::__cxx11::basic_string<char>,_int,_double,_NS_*>.
               super__Move_ctor_alias<std::__cxx11::basic_string<char>,_int,_double,_NS_*>.
               super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_int,_double,_NS_*>.
               super__Variant_storage_alias<std::__cxx11::basic_string<char>,_int,_double,_NS_*>.
               _M_u);
  return;
}

Assistant:

ostream& operator<<(ostream& os_stream, const N& n) {
    visit([&](auto &&data){
        using T = decay_t<decltype(data)>;
        if constexpr (is_same_v<T, int>) os_stream << data;
        else if constexpr (is_same_v<T, double>) os_stream << data;
        else if constexpr (is_same_v<T, std::string>) os_stream << '"' << data << '"';
        else if constexpr (is_same_v<T, NS*>) os_stream << "\"Nested\"";
    }, n.data);

    return os_stream;
}